

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O3

void discover_object(int oindx,boolean mark_as_known,boolean credit_hero)

{
  objclass *poVar1;
  short *psVar2;
  short *psVar3;
  int iVar4;
  
  poVar1 = objects;
  if ((objects[oindx].field_0x10 & 1) == 0) {
    psVar2 = disco + bases[objects[oindx].oc_class];
    do {
      psVar3 = psVar2;
      if (*psVar3 == 0) break;
      psVar2 = psVar3 + 1;
    } while (*psVar3 != oindx);
    *psVar3 = (short)oindx;
    if (mark_as_known != '\0') {
      poVar1[oindx].field_0x10 = poVar1[oindx].field_0x10 | 1;
      if (credit_hero != '\0') {
        exercise(2,'\x01');
      }
      iVar4 = -0xb;
      if ((oindx - 0x5fU < 0xb) || (iVar4 = 0xb, oindx - 0x54U < 0xb)) {
        discover_object(iVar4 + oindx,mark_as_known,'\0');
      }
    }
    if (1 < moves) {
      update_inventory();
      return;
    }
  }
  return;
}

Assistant:

void discover_object(int oindx, boolean mark_as_known, boolean credit_hero)
{
    if (!objects[oindx].oc_name_known) {
	int dindx, acls = objects[oindx].oc_class;

	/* Loop thru disco[] 'til we find the target (which may have been
	   uname'd) or the next open slot; one or the other will be found
	   before we reach the next class...
	 */
	for (dindx = bases[acls]; disco[dindx] != 0; dindx++)
	    if (disco[dindx] == oindx) break;
	disco[dindx] = oindx;

	if (mark_as_known) {
	    objects[oindx].oc_name_known = 1;
	    if (credit_hero) exercise(A_WIS, TRUE);

	    if (Is_dragon_scales(oindx))
		discover_object(Dragon_scales_to_mail(oindx), mark_as_known, FALSE);
	    else if (Is_dragon_mail(oindx))
		discover_object(Dragon_mail_to_scales(oindx), mark_as_known, FALSE);
	}
	if (moves > 1L) update_inventory();
    }
}